

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O2

void convertARGBToARGB32PM_sse4<false>(uint *buffer,uint *src,int count)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  QRgb QVar4;
  uint uVar5;
  long lVar6;
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM4 [16];
  ushort uVar9;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  undefined1 in_XMM5 [16];
  undefined1 auVar10 [16];
  ushort uVar18;
  undefined1 auVar11 [16];
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  undefined1 in_XMM6 [16];
  ushort uVar26;
  
  auVar3 = _DAT_005f11c0;
  lVar6 = 0;
  auVar7 = pmovzxbw(in_XMM2,0x8080808080808080);
  for (; lVar6 < count + -3; lVar6 = lVar6 + 4) {
    auVar11 = *(undefined1 (*) [16])(src + lVar6);
    if ((auVar3 & auVar11) == (undefined1  [16])0x0) {
      *(undefined1 (*) [16])(buffer + lVar6) = (undefined1  [16])0x0;
    }
    else if ((auVar3 & ~auVar11) == (undefined1  [16])0x0) {
      if (buffer != src) {
        *(undefined1 (*) [16])(buffer + lVar6) = auVar11;
      }
    }
    else {
      in_XMM4 = pmovzxbw(in_XMM4,auVar11);
      auVar8._0_2_ = CONCAT11(0,auVar11[8]);
      auVar8[2] = auVar11[9];
      auVar8[3] = 0;
      auVar8[4] = auVar11[10];
      auVar8[5] = 0;
      auVar8[6] = auVar11[0xb];
      auVar8[7] = 0;
      auVar8[8] = auVar11[0xc];
      auVar8[9] = 0;
      auVar8[10] = auVar11[0xd];
      auVar8[0xb] = 0;
      auVar8[0xc] = auVar11[0xe];
      auVar8[0xd] = 0;
      auVar8[0xe] = auVar11[0xf];
      auVar8[0xf] = 0;
      auVar10 = pshuflw(in_XMM5,in_XMM4,0xff);
      auVar10 = pshufhw(auVar10,auVar10,0xff);
      uVar9 = auVar10._0_2_ * in_XMM4._0_2_;
      uVar12 = auVar10._2_2_ * in_XMM4._2_2_;
      uVar13 = auVar10._4_2_ * in_XMM4._4_2_;
      uVar14 = auVar10._6_2_ * in_XMM4._6_2_;
      uVar15 = auVar10._8_2_ * in_XMM4._8_2_;
      uVar16 = auVar10._10_2_ * in_XMM4._10_2_;
      uVar17 = auVar10._12_2_ * in_XMM4._12_2_;
      uVar18 = auVar10._14_2_ * in_XMM4._14_2_;
      auVar10 = pshuflw(in_XMM6,auVar8,0xff);
      auVar10 = pshufhw(auVar10,auVar10,0xff);
      uVar19 = auVar10._0_2_ * auVar8._0_2_;
      uVar20 = auVar10._2_2_ * (ushort)auVar11[9];
      uVar21 = auVar10._4_2_ * (ushort)auVar11[10];
      uVar22 = auVar10._6_2_ * (ushort)auVar11[0xb];
      uVar23 = auVar10._8_2_ * (ushort)auVar11[0xc];
      uVar24 = auVar10._10_2_ * (ushort)auVar11[0xd];
      uVar25 = auVar10._12_2_ * (ushort)auVar11[0xe];
      uVar26 = auVar10._14_2_ * (ushort)auVar11[0xf];
      auVar11._0_2_ = (ushort)(uVar9 + auVar7._0_2_ + (uVar9 >> 8)) >> 8;
      auVar11._2_2_ = (ushort)(uVar12 + auVar7._2_2_ + (uVar12 >> 8)) >> 8;
      auVar11._4_2_ = (ushort)(uVar13 + auVar7._4_2_ + (uVar13 >> 8)) >> 8;
      auVar11._6_2_ = (ushort)(uVar14 + auVar7._6_2_ + (uVar14 >> 8)) >> 8;
      auVar11._8_2_ = (ushort)(uVar15 + auVar7._8_2_ + (uVar15 >> 8)) >> 8;
      auVar11._10_2_ = (ushort)(uVar16 + auVar7._10_2_ + (uVar16 >> 8)) >> 8;
      auVar11._12_2_ = (ushort)(uVar17 + auVar7._12_2_ + (uVar17 >> 8)) >> 8;
      auVar11._14_2_ = (ushort)(uVar18 + auVar7._14_2_ + (uVar18 >> 8)) >> 8;
      auVar10._0_2_ = (ushort)(uVar19 + auVar7._0_2_ + (uVar19 >> 8)) >> 8;
      auVar10._2_2_ = (ushort)(uVar20 + auVar7._2_2_ + (uVar20 >> 8)) >> 8;
      auVar10._4_2_ = (ushort)(uVar21 + auVar7._4_2_ + (uVar21 >> 8)) >> 8;
      auVar10._6_2_ = (ushort)(uVar22 + auVar7._6_2_ + (uVar22 >> 8)) >> 8;
      auVar10._8_2_ = (ushort)(uVar23 + auVar7._8_2_ + (uVar23 >> 8)) >> 8;
      auVar10._10_2_ = (ushort)(uVar24 + auVar7._10_2_ + (uVar24 >> 8)) >> 8;
      auVar10._12_2_ = (ushort)(uVar25 + auVar7._12_2_ + (uVar25 >> 8)) >> 8;
      auVar10._14_2_ = (ushort)(uVar26 + auVar7._14_2_ + (uVar26 >> 8)) >> 8;
      auVar11 = pblendw(auVar11,in_XMM4,0x88);
      in_XMM6 = pblendw(auVar10,auVar8,0x88);
      sVar1 = auVar11._0_2_;
      sVar2 = auVar11._2_2_;
      in_XMM5[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar11[2] - (0xff < sVar2);
      in_XMM5[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar11[0] - (0xff < sVar1);
      sVar1 = auVar11._4_2_;
      in_XMM5[2] = (0 < sVar1) * (sVar1 < 0x100) * auVar11[4] - (0xff < sVar1);
      sVar1 = auVar11._6_2_;
      in_XMM5[3] = (0 < sVar1) * (sVar1 < 0x100) * auVar11[6] - (0xff < sVar1);
      sVar1 = auVar11._8_2_;
      in_XMM5[4] = (0 < sVar1) * (sVar1 < 0x100) * auVar11[8] - (0xff < sVar1);
      sVar1 = auVar11._10_2_;
      in_XMM5[5] = (0 < sVar1) * (sVar1 < 0x100) * auVar11[10] - (0xff < sVar1);
      sVar1 = auVar11._12_2_;
      in_XMM5[6] = (0 < sVar1) * (sVar1 < 0x100) * auVar11[0xc] - (0xff < sVar1);
      sVar1 = auVar11._14_2_;
      in_XMM5[7] = (0 < sVar1) * (sVar1 < 0x100) * auVar11[0xe] - (0xff < sVar1);
      sVar1 = in_XMM6._0_2_;
      in_XMM5[8] = (0 < sVar1) * (sVar1 < 0x100) * in_XMM6[0] - (0xff < sVar1);
      sVar1 = in_XMM6._2_2_;
      in_XMM5[9] = (0 < sVar1) * (sVar1 < 0x100) * in_XMM6[2] - (0xff < sVar1);
      sVar1 = in_XMM6._4_2_;
      in_XMM5[10] = (0 < sVar1) * (sVar1 < 0x100) * in_XMM6[4] - (0xff < sVar1);
      sVar1 = in_XMM6._6_2_;
      in_XMM5[0xb] = (0 < sVar1) * (sVar1 < 0x100) * in_XMM6[6] - (0xff < sVar1);
      sVar1 = in_XMM6._8_2_;
      in_XMM5[0xc] = (0 < sVar1) * (sVar1 < 0x100) * in_XMM6[8] - (0xff < sVar1);
      sVar1 = in_XMM6._10_2_;
      in_XMM5[0xd] = (0 < sVar1) * (sVar1 < 0x100) * in_XMM6[10] - (0xff < sVar1);
      sVar1 = in_XMM6._12_2_;
      in_XMM5[0xe] = (0 < sVar1) * (sVar1 < 0x100) * in_XMM6[0xc] - (0xff < sVar1);
      sVar1 = in_XMM6._14_2_;
      in_XMM5[0xf] = (0 < sVar1) * (sVar1 < 0x100) * in_XMM6[0xe] - (0xff < sVar1);
      *(undefined1 (*) [16])(buffer + lVar6) = in_XMM5;
    }
  }
  uVar5 = 0;
  for (; (uVar5 < 3 && (lVar6 < count)); lVar6 = lVar6 + 1) {
    QVar4 = qPremultiply(src[lVar6]);
    buffer[lVar6] = QVar4;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

static void convertARGBToARGB32PM_sse4(uint *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i half = _mm_set1_epi16(0x0080);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            if (!_mm_testc_si128(srcVector, alphaMask)) {
                if (RGBA)
                    srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
                __m128i src1 = _mm_unpacklo_epi8(srcVector, zero);
                __m128i src2 = _mm_unpackhi_epi8(srcVector, zero);
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                src1 = _mm_mullo_epi16(src1, alpha1);
                src2 = _mm_mullo_epi16(src2, alpha2);
                src1 = _mm_add_epi16(src1, _mm_srli_epi16(src1, 8));
                src2 = _mm_add_epi16(src2, _mm_srli_epi16(src2, 8));
                src1 = _mm_add_epi16(src1, half);
                src2 = _mm_add_epi16(src2, half);
                src1 = _mm_srli_epi16(src1, 8);
                src2 = _mm_srli_epi16(src2, 8);
                src1 = _mm_blend_epi16(src1, alpha1, 0x88);
                src2 = _mm_blend_epi16(src2, alpha2, 0x88);
                srcVector = _mm_packus_epi16(src1, src2);
                _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            } else {
                if (RGBA)
                    _mm_storeu_si128((__m128i *)&buffer[i], _mm_shuffle_epi8(srcVector, rgbaMask));
                else if (buffer != src)
                    _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        uint v = qPremultiply(src[i]);
        buffer[i] = RGBA ? RGBA2ARGB(v) : v;
    }
}